

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void __thiscall
btLCP::transfer_i_from_C_to_N(btLCP *this,int i,btAlignedObjectArray<float> *scratch)

{
  uint n2;
  int iVar1;
  int *p;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int r;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int i2;
  int do_fast_row_swaps;
  
  p = this->m_C;
  n2 = this->m_nC;
  i2 = n2 - 1;
  uVar7 = 0;
  uVar4 = 0;
  if (0 < (int)n2) {
    uVar4 = (ulong)n2;
  }
  uVar10 = 0xffffffffffffffff;
  do_fast_row_swaps = -4;
  lVar6 = -4;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    r = (int)uVar7;
    uVar2 = uVar10;
    if (p[uVar7] == i2) {
      uVar2 = uVar7;
    }
    uVar10 = uVar2 & 0xffffffff;
    if (p[uVar7] == i) {
      do_fast_row_swaps = -4;
      btLDLTRemove(this->m_A,p,this->m_L,this->m_d,this->m_nskip,n2,r,this->m_nskip,scratch);
      uVar9 = (uint)uVar2;
      if ((uint)uVar2 != 0xffffffff) goto LAB_00195458;
      uVar3 = r + 1U;
      if ((int)(r + 1U) < (int)n2) {
        uVar3 = n2;
      }
      uVar4 = uVar7 & 0xffffffff;
      piVar5 = (int *)((long)p - lVar6);
      goto LAB_0019543f;
    }
    lVar6 = lVar6 + -4;
  }
  goto LAB_0019548f;
  while (iVar1 = *piVar5, piVar5 = piVar5 + 1, uVar9 = uVar8, iVar1 != i2) {
LAB_0019543f:
    uVar8 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar8;
    uVar9 = uVar3;
    if ((int)n2 <= (int)uVar8) break;
  }
LAB_00195458:
  p[(int)uVar9] = p[uVar7];
  if (r < i2) {
    do_fast_row_swaps = 0x19548a;
    memmove(p + uVar7,p + uVar7 + 1,(long)(i2 - r) << 2);
  }
LAB_0019548f:
  btSwapProblem(this->m_A,this->m_x,this->m_b,this->m_w,this->m_lo,this->m_hi,this->m_p,
                this->m_state,this->m_findex,this->m_n,i,i2,1,do_fast_row_swaps);
  this->m_nN = this->m_nN + 1;
  this->m_nC = i2;
  return;
}

Assistant:

void btLCP::transfer_i_from_C_to_N (int i, btAlignedObjectArray<btScalar>& scratch)
{
  {
    int *C = m_C;
    // remove a row/column from the factorization, and adjust the
    // indexes (black magic!)
    int last_idx = -1;
    const int nC = m_nC;
    int j = 0;
    for ( ; j<nC; ++j) {
      if (C[j]==nC-1) {
        last_idx = j;
      }
      if (C[j]==i) {
        btLDLTRemove (m_A,C,m_L,m_d,m_n,nC,j,m_nskip,scratch);
        int k;
        if (last_idx == -1) {
          for (k=j+1 ; k<nC; ++k) {
            if (C[k]==nC-1) {
              break;
            }
          }
          btAssert (k < nC);
        }
        else {
          k = last_idx;
        }
        C[k] = C[j];
        if (j < (nC-1)) memmove (C+j,C+j+1,(nC-j-1)*sizeof(int));
        break;
      }
    }
    btAssert (j < nC);

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,i,nC-1,m_nskip,1);

    m_nN++;
    m_nC = nC - 1; // nC value is outdated after this line
  }

}